

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webassembly.cc
# Opt level: O0

void bloaty::wasm::ParseSections(RangeSink *sink)

{
  InputFile *this;
  RangeSink *in_RDI;
  anon_class_8_1_89918b91 *in_stack_00000040;
  undefined1 in_stack_00000048 [16];
  
  this = RangeSink::input_file(in_RDI);
  InputFile::data(this);
  ForEachSection<bloaty::wasm::ParseSections(bloaty::RangeSink*)::__0>
            ((string_view)in_stack_00000048,in_stack_00000040);
  return;
}

Assistant:

void ParseSections(RangeSink* sink) {
  ForEachSection(sink->input_file().data(), [sink](const Section& section) {
    sink->AddFileRange("wasm_sections", section.name, section.data);
  });
}